

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void init_file_paths(char *configpath,char *libpath,char *datapath)

{
  int iVar1;
  char *userpath;
  char buf [1024];
  char *datapath_local;
  char *libpath_local;
  char *configpath_local;
  
  string_free(ANGBAND_DIR_GAMEDATA);
  string_free(ANGBAND_DIR_CUSTOMIZE);
  string_free(ANGBAND_DIR_HELP);
  string_free(ANGBAND_DIR_SCREENS);
  string_free(ANGBAND_DIR_FONTS);
  string_free(ANGBAND_DIR_TILES);
  string_free(ANGBAND_DIR_SOUNDS);
  string_free(ANGBAND_DIR_ICONS);
  string_free(ANGBAND_DIR_USER);
  string_free(ANGBAND_DIR_SAVE);
  string_free(ANGBAND_DIR_PANIC);
  string_free(ANGBAND_DIR_SCORES);
  string_free(ANGBAND_DIR_ARCHIVE);
  path_build((char *)&userpath,0x400,configpath,"gamedata");
  ANGBAND_DIR_GAMEDATA = string_make((char *)&userpath);
  path_build((char *)&userpath,0x400,configpath,"customize");
  ANGBAND_DIR_CUSTOMIZE = string_make((char *)&userpath);
  path_build((char *)&userpath,0x400,libpath,"help");
  ANGBAND_DIR_HELP = string_make((char *)&userpath);
  path_build((char *)&userpath,0x400,libpath,"screens");
  ANGBAND_DIR_SCREENS = string_make((char *)&userpath);
  path_build((char *)&userpath,0x400,libpath,"fonts");
  ANGBAND_DIR_FONTS = string_make((char *)&userpath);
  path_build((char *)&userpath,0x400,libpath,"tiles");
  ANGBAND_DIR_TILES = string_make((char *)&userpath);
  path_build((char *)&userpath,0x400,libpath,"sounds");
  ANGBAND_DIR_SOUNDS = string_make((char *)&userpath);
  path_build((char *)&userpath,0x400,libpath,"icons");
  ANGBAND_DIR_ICONS = string_make((char *)&userpath);
  iVar1 = strncmp(ANGBAND_SYS,"test",4);
  if (iVar1 == 0) {
    path_build((char *)&userpath,0x400,"~/.angband","Test");
  }
  else {
    path_build((char *)&userpath,0x400,"~/.angband","Angband");
  }
  ANGBAND_DIR_USER = string_make((char *)&userpath);
  path_build((char *)&userpath,0x400,ANGBAND_DIR_USER,"archive");
  ANGBAND_DIR_ARCHIVE = string_make((char *)&userpath);
  path_build((char *)&userpath,0x400,datapath,"scores");
  ANGBAND_DIR_SCORES = string_make((char *)&userpath);
  path_build((char *)&userpath,0x400,datapath,"save");
  ANGBAND_DIR_SAVE = string_make((char *)&userpath);
  path_build((char *)&userpath,0x400,datapath,"panic");
  ANGBAND_DIR_PANIC = string_make((char *)&userpath);
  return;
}

Assistant:

void init_file_paths(const char *configpath, const char *libpath, const char *datapath)
{
	char buf[1024];
	char *userpath = NULL;

	/*** Free everything ***/

	/* Free the sub-paths */
	string_free(ANGBAND_DIR_GAMEDATA);
	string_free(ANGBAND_DIR_CUSTOMIZE);
	string_free(ANGBAND_DIR_HELP);
	string_free(ANGBAND_DIR_SCREENS);
	string_free(ANGBAND_DIR_FONTS);
	string_free(ANGBAND_DIR_TILES);
	string_free(ANGBAND_DIR_SOUNDS);
	string_free(ANGBAND_DIR_ICONS);
	string_free(ANGBAND_DIR_USER);
	string_free(ANGBAND_DIR_SAVE);
	string_free(ANGBAND_DIR_PANIC);
	string_free(ANGBAND_DIR_SCORES);
	string_free(ANGBAND_DIR_ARCHIVE);

	/*** Prepare the paths ***/

#define BUILD_DIRECTORY_PATH(dest, basepath, dirname) { \
	path_build(buf, sizeof(buf), (basepath), (dirname)); \
	dest = string_make(buf); \
}

	/* Paths generally containing configuration data for Angband. */
#ifdef GAMEDATA_IN_LIB
	BUILD_DIRECTORY_PATH(ANGBAND_DIR_GAMEDATA, libpath, "gamedata");
#else
	BUILD_DIRECTORY_PATH(ANGBAND_DIR_GAMEDATA, configpath, "gamedata");
#endif
	BUILD_DIRECTORY_PATH(ANGBAND_DIR_CUSTOMIZE, configpath, "customize");
	BUILD_DIRECTORY_PATH(ANGBAND_DIR_HELP, libpath, "help");
	BUILD_DIRECTORY_PATH(ANGBAND_DIR_SCREENS, libpath, "screens");
	BUILD_DIRECTORY_PATH(ANGBAND_DIR_FONTS, libpath, "fonts");
	BUILD_DIRECTORY_PATH(ANGBAND_DIR_TILES, libpath, "tiles");
	BUILD_DIRECTORY_PATH(ANGBAND_DIR_SOUNDS, libpath, "sounds");
	BUILD_DIRECTORY_PATH(ANGBAND_DIR_ICONS, libpath, "icons");

#ifdef PRIVATE_USER_PATH

	/* Build the path to the user specific directory */
	if (strncmp(ANGBAND_SYS, "test", 4) == 0)
		path_build(buf, sizeof(buf), PRIVATE_USER_PATH, "Test");
	else
		path_build(buf, sizeof(buf), PRIVATE_USER_PATH, VERSION_NAME);
	ANGBAND_DIR_USER = string_make(buf);

#else /* !PRIVATE_USER_PATH */

#ifdef MACH_O_CARBON
	/* Remove any trailing separators, since some deeper path creation functions
	 * don't like directories with trailing slashes. */
	if (suffix(datapath, PATH_SEP)) {
		/* Hacky way to trim the separator. Since this is just for OS X, we can
		 * assume a one char separator. */
		int last_char_index = strlen(datapath) - 1;
		my_strcpy(buf, datapath, sizeof(buf));
		buf[last_char_index] = '\0';
		ANGBAND_DIR_USER = string_make(buf);
	}
	else {
		ANGBAND_DIR_USER = string_make(datapath);
	}
#else /* !MACH_O_CARBON */
	BUILD_DIRECTORY_PATH(ANGBAND_DIR_USER, datapath, "user");
#endif /* MACH_O_CARBON */

#endif /* PRIVATE_USER_PATH */

	/* Build the path to the archive directory. */
	BUILD_DIRECTORY_PATH(ANGBAND_DIR_ARCHIVE, ANGBAND_DIR_USER, "archive");

#ifdef USE_PRIVATE_PATHS
	userpath = ANGBAND_DIR_USER;
#else /* !USE_PRIVATE_PATHS */
	userpath = (char *)datapath;
#endif /* USE_PRIVATE_PATHS */

	/* Build the path to the score and save directories */
	BUILD_DIRECTORY_PATH(ANGBAND_DIR_SCORES, userpath, "scores");
	BUILD_DIRECTORY_PATH(ANGBAND_DIR_SAVE, userpath, "save");
	BUILD_DIRECTORY_PATH(ANGBAND_DIR_PANIC, userpath, "panic");

#undef BUILD_DIRECTORY_PATH
}